

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::RigidBody::getGrad
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RigidBody *this)

{
  pointer pdVar1;
  double dVar2;
  double dVar3;
  int j;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3d etheta;
  Vector3d torque;
  Vector3d epsi;
  Vector3d ephi;
  Vector3d myEuler;
  Vector3d force;
  RotMat3x3d local_70;
  Vector<double,_3U> local_28;
  
  local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,6,(value_type_conflict2 *)&local_70,(allocator_type *)&force);
  Vector<double,_3U>::Vector(&force.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&torque.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&myEuler.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&ephi.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&etheta.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&epsi.super_Vector<double,_3U>);
  StuntDouble::getFrc((Vector3d *)&local_70,&this->super_StuntDouble);
  Vector<double,_3U>::operator=(&force.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_70);
  StuntDouble::getTrq((Vector3d *)&local_70,&this->super_StuntDouble);
  Vector<double,_3U>::operator=(&torque.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_70);
  StuntDouble::getA(&local_70,&this->super_StuntDouble);
  SquareMatrix3<double>::toEulerAngles((Vector3<double> *)&local_28,&local_70);
  Vector<double,_3U>::operator=(&myEuler.super_Vector<double,_3U>,&local_28);
  dVar2 = cos(myEuler.super_Vector<double,_3U>.data_[0]);
  dVar5 = sin(myEuler.super_Vector<double,_3U>.data_[0]);
  dVar6 = cos(myEuler.super_Vector<double,_3U>.data_[1]);
  dVar3 = sin(myEuler.super_Vector<double,_3U>.data_[1]);
  auVar9._0_8_ = ~-(ulong)(ABS(dVar3) < 1e-09) & (ulong)dVar3 |
                 -(ulong)(ABS(dVar3) < 1e-09) & 0x3e112e0be826d695;
  auVar7._0_8_ = -dVar5 * dVar6;
  auVar7._8_8_ = dVar2 * dVar6;
  auVar9._8_8_ = auVar9._0_8_;
  auVar7 = divpd(auVar7,auVar9);
  ephi.super_Vector<double,_3U>.data_[0] = (double)auVar7._0_8_;
  ephi.super_Vector<double,_3U>.data_[1] = (double)auVar7._8_8_;
  etheta.super_Vector<double,_3U>.data_[0] = dVar2;
  etheta.super_Vector<double,_3U>.data_[1] = dVar5;
  etheta.super_Vector<double,_3U>.data_[2] = 0.0;
  auVar8._8_8_ = -dVar2;
  auVar8._0_8_ = dVar5;
  auVar9 = divpd(auVar8,auVar9);
  epsi.super_Vector<double,_3U>.data_[0] = (double)auVar9._0_8_;
  epsi.super_Vector<double,_3U>.data_[1] = (double)auVar9._8_8_;
  epsi.super_Vector<double,_3U>.data_[2] = 0.0;
  ephi.super_Vector<double,_3U>.data_[2] = 1.0;
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pdVar1[lVar4] = -force.super_Vector<double,_3U>.data_[lVar4];
  }
  dVar2 = pdVar1[3];
  dVar5 = pdVar1[4];
  dVar6 = pdVar1[5];
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    dVar2 = dVar2 - torque.super_Vector<double,_3U>.data_[lVar4] *
                    ephi.super_Vector<double,_3U>.data_[lVar4];
    pdVar1[3] = dVar2;
    dVar5 = dVar5 - torque.super_Vector<double,_3U>.data_[lVar4] *
                    etheta.super_Vector<double,_3U>.data_[lVar4];
    pdVar1[4] = dVar5;
    dVar6 = dVar6 - torque.super_Vector<double,_3U>.data_[lVar4] *
                    epsi.super_Vector<double,_3U>.data_[lVar4];
    pdVar1[5] = dVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> RigidBody::getGrad() {
    std::vector<RealType> grad(6, 0.0);
    Vector3d force;
    Vector3d torque;
    Vector3d myEuler;
    RealType phi, theta;
    RealType cphi, sphi, ctheta, stheta;
    Vector3d ephi;
    Vector3d etheta;
    Vector3d epsi;

    force  = getFrc();
    torque = getTrq();

    myEuler = getA().toEulerAngles();

    phi   = myEuler[0];
    theta = myEuler[1];

    cphi   = cos(phi);
    sphi   = sin(phi);
    ctheta = cos(theta);
    stheta = sin(theta);

    if (fabs(stheta) < 1.0E-9) { stheta = 1.0E-9; }

    ephi[0] = -sphi * ctheta / stheta;
    ephi[1] = cphi * ctheta / stheta;
    ephi[2] = 1.0;

    etheta[0] = cphi;
    etheta[1] = sphi;
    etheta[2] = 0.0;

    epsi[0] = sphi / stheta;
    epsi[1] = -cphi / stheta;
    epsi[2] = 0.0;

    // gradient is equal to -force
    for (int j = 0; j < 3; j++)
      grad[j] = -force[j];

    for (int j = 0; j < 3; j++) {
      grad[3] -= torque[j] * ephi[j];
      grad[4] -= torque[j] * etheta[j];
      grad[5] -= torque[j] * epsi[j];
    }

    return grad;
  }